

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void build_smooth_interintra_mask
               (uint8_t *mask,int stride,BLOCK_SIZE plane_bsize,INTERINTRA_MODE mode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  uint8_t *puVar6;
  ulong __n;
  ulong uVar7;
  bool bVar8;
  
  uVar5 = CONCAT71(in_register_00000011,plane_bsize) & 0xffffffff;
  __n = (ulong)block_size_wide[uVar5];
  bVar1 = block_size_high[uVar5];
  uVar7 = (ulong)bVar1;
  bVar2 = " \x10\x10\x10\b\b\b\x04\x04\x04\x02\x02\x02\x01\x01\x01\b\b\x04\x04\x02\x02"[uVar5];
  iVar3 = (int)CONCAT71(in_register_00000009,mode);
  if (iVar3 == 1) {
    puVar6 = 
    "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
    ;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      memset(mask,(uint)*puVar6,__n);
      mask = mask + (uint)stride;
      puVar6 = puVar6 + bVar2;
    }
  }
  else if (iVar3 == 2) {
    for (uVar4 = 0; uVar4 != bVar1; uVar4 = uVar4 + 1) {
      puVar6 = 
      "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
      ;
      for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
        mask[uVar5] = *puVar6;
        puVar6 = puVar6 + bVar2;
      }
      mask = mask + (uint)stride;
    }
  }
  else if (iVar3 == 3) {
    for (uVar4 = 0; uVar4 != bVar1; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
        uVar7 = uVar5 & 0xffffffff;
        if (uVar4 < (uint)uVar5) {
          uVar7 = (ulong)uVar4;
        }
        mask[uVar5] = "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                      [uVar7 * bVar2];
      }
      mask = mask + (uint)stride;
    }
  }
  else {
    while (iVar3 = (int)uVar7, uVar7 = (ulong)(iVar3 - 1), iVar3 != 0) {
      memset(mask,0x20,__n);
      mask = mask + (uint)stride;
    }
  }
  return;
}

Assistant:

static inline void build_smooth_interintra_mask(uint8_t *mask, int stride,
                                                BLOCK_SIZE plane_bsize,
                                                INTERINTRA_MODE mode) {
  int i, j;
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];
  const int size_scale = ii_size_scales[plane_bsize];

  switch (mode) {
    case II_V_PRED:
      for (i = 0; i < bh; ++i) {
        memset(mask, ii_weights1d[i * size_scale], bw * sizeof(mask[0]));
        mask += stride;
      }
      break;

    case II_H_PRED:
      for (i = 0; i < bh; ++i) {
        for (j = 0; j < bw; ++j) mask[j] = ii_weights1d[j * size_scale];
        mask += stride;
      }
      break;

    case II_SMOOTH_PRED:
      for (i = 0; i < bh; ++i) {
        for (j = 0; j < bw; ++j)
          mask[j] = ii_weights1d[(i < j ? i : j) * size_scale];
        mask += stride;
      }
      break;

    case II_DC_PRED:
    default:
      for (i = 0; i < bh; ++i) {
        memset(mask, 32, bw * sizeof(mask[0]));
        mask += stride;
      }
      break;
  }
}